

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

void __thiscall
Inferences::InductionClauseIterator::performStructInductionFreeVar
          (InductionClauseIterator *this,InductionContext *context,Entry *e,
          Substitution *freeVarSubst)

{
  pointer ppTVar1;
  undefined8 *puVar2;
  InductionContext *this_00;
  TermAlgebraConstructor *this_01;
  Substitution *this_02;
  uint uVar3;
  uint uVar4;
  TermList TVar5;
  Entry *pEVar6;
  undefined4 extraout_var;
  void *pvVar7;
  uint *puVar8;
  TermList TVar9;
  uint *puVar10;
  Formula *pFVar11;
  FormulaList *pFVar12;
  Formula *pFVar13;
  Formula *pFVar14;
  undefined8 *puVar15;
  ulong uVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  int *piVar19;
  Entry *pEVar20;
  Term *pTVar21;
  socklen_t __len;
  DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2> *this_03;
  _Hash_node_base *p_Var22;
  TermList TVar23;
  ulong uVar24;
  void **head_14;
  void **head;
  void **head_15;
  uint ith;
  void **head_7;
  initializer_list<Kernel::TermList> __l;
  initializer_list<Kernel::TermList> __l_00;
  initializer_list<Kernel::TermList> __l_01;
  TermList x;
  Substitution subst;
  DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> bindings;
  ClauseStack hyp_clauses;
  uint *local_128;
  uint local_11c;
  uint *local_118;
  TermList local_110;
  undefined1 local_108 [20];
  int iStack_f4;
  undefined8 uStack_f0;
  undefined4 uStack_e8;
  undefined4 local_e4;
  undefined8 local_e0;
  InductionContext *local_d8;
  FormulaList *local_d0;
  TermAlgebraConstructor *local_c8;
  TermAlgebra *local_c0;
  ulong local_b8;
  DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> local_b0;
  ClauseStack local_88;
  Entry *local_68;
  Substitution *local_60;
  InductionClauseIterator *local_58;
  Array<Shell::TermAlgebraConstructor_*> *local_50;
  undefined8 *local_48;
  uint *local_40;
  ulong local_38;
  
  ppTVar1 = (context->_indTerms).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(context->_indTerms).
                    super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppTVar1) < 9) {
    this_03 = (DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
              (DAT_00b7e1b0 + 0x268);
    local_68 = e;
    local_58 = this;
    TVar5 = Kernel::SortHelper::getResultSort(*ppTVar1);
    local_108._0_4_ = *(uint *)(TVar5._content + 8);
    pEVar6 = ::Lib::DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
             findEntry(this_03,(uint *)local_108);
    local_c0 = pEVar6->_val;
    uVar3 = InductionContext::getFreeVariable(context);
    local_e0 = CONCAT44(extraout_var,uVar3);
    uVar3 = uVar3 + 1;
    p_Var22 = (context->_cls)._M_h._M_before_begin._M_nxt;
    local_d8 = context;
    while( true ) {
      if (p_Var22 == (_Hash_node_base *)0x0) break;
      uVar4 = Kernel::Clause::maxVar((Clause *)p_Var22[1]._M_nxt);
      if (uVar3 < uVar4 + 1) {
        uVar3 = Kernel::Clause::maxVar((Clause *)p_Var22[1]._M_nxt);
        uVar3 = uVar3 + 1;
      }
      p_Var22 = p_Var22->_M_nxt;
    }
    local_60 = freeVarSubst;
    if (local_c0->_n == 0) {
      puVar15 = (undefined8 *)0x0;
      puVar8 = (uint *)0x0;
      local_128 = (uint *)0x0;
      puVar10 = (uint *)0x0;
    }
    else {
      local_50 = &local_c0->_constrs;
      uVar16 = 0;
      puVar10 = (uint *)0x0;
      local_128 = (uint *)0x0;
      puVar8 = (uint *)0x0;
      puVar15 = (undefined8 *)0x0;
      do {
        local_b8 = uVar16;
        local_48 = puVar15;
        local_40 = puVar10;
        if ((local_c0->_constrs)._capacity <= uVar16) {
          ::Lib::Array<Shell::TermAlgebraConstructor_*>::expandToFit(local_50,uVar16);
        }
        local_c8 = (local_c0->_constrs)._array[local_b8];
        local_108._0_4_ = Shell::TermAlgebraConstructor::arity(local_c8);
        uVar16 = (ulong)(uint)local_108._0_4_;
        local_108._4_4_ = 0;
        if (local_108._0_4_ == 0) {
          local_108._8_4_ = 0;
          local_108._12_4_ = 0;
        }
        else {
          uVar24 = uVar16 * 8 + 0xf & 0xffffffff0;
          if (uVar24 == 0) {
            pvVar7 = ::Lib::FixedSizeAllocator<8UL>::alloc
                               ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
          }
          else if (uVar24 < 0x11) {
            pvVar7 = ::Lib::FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)
                                (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
          }
          else if (uVar24 < 0x19) {
            pvVar7 = ::Lib::FixedSizeAllocator<24UL>::alloc
                               ((FixedSizeAllocator<24UL> *)
                                (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
          }
          else if (uVar24 < 0x21) {
            pvVar7 = ::Lib::FixedSizeAllocator<32UL>::alloc
                               ((FixedSizeAllocator<32UL> *)
                                (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
          }
          else if (uVar24 < 0x31) {
            pvVar7 = ::Lib::FixedSizeAllocator<48UL>::alloc
                               ((FixedSizeAllocator<48UL> *)
                                (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
          }
          else if (uVar24 < 0x41) {
            pvVar7 = ::Lib::FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)
                                (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
          }
          else {
            pvVar7 = ::operator_new(uVar24,0x10);
          }
          local_108._8_4_ = SUB84(pvVar7,0);
          local_108._12_4_ = (undefined4)((ulong)pvVar7 >> 0x20);
        }
        unique0x10000796 = (Entry *)CONCAT44(local_108._12_4_,local_108._8_4_);
        uStack_f0 = (Entry *)(CONCAT44(local_108._12_4_,local_108._8_4_) +
                             CONCAT44(local_108._4_4_,local_108._0_4_) * 8);
        if (uVar16 == 0) {
          local_d0 = (FormulaList *)0x0;
          unique0x100010d3 = (Entry *)CONCAT44(local_108._12_4_,local_108._8_4_);
        }
        else {
          ith = 0;
          local_118 = local_128;
          local_d0 = (FormulaList *)0x0;
          puVar10 = puVar8;
          uVar4 = uVar3;
          local_38 = uVar16;
          do {
            if (unique0x1000078e == uStack_f0) {
              ::Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)local_108);
            }
            TVar23._content._0_4_ = uVar4 * 4 + 1;
            TVar23._content._4_4_ = 0;
            unique0x100007f6->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)(uint)TVar23._content;
            unique0x100007f6->_key = 0;
            register0x00000000 = (Entry *)&unique0x100007f6->_val;
            puVar8 = (uint *)::Lib::FixedSizeAllocator<16UL>::alloc
                                       ((FixedSizeAllocator<16UL> *)
                                        (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
            this_01 = local_c8;
            *puVar8 = uVar4 & 0x3fffffff;
            *(uint **)(puVar8 + 2) = puVar10;
            TVar5 = Shell::TermAlgebraConstructor::argSort(local_c8,ith);
            TVar9 = Shell::TermAlgebraConstructor::rangeSort(this_01);
            uVar3 = uVar4 + 1;
            if (TVar5._content == TVar9._content) {
              local_88._capacity = (size_t)(uVar3 * 4 + 1);
              puVar10 = (uint *)::Lib::FixedSizeAllocator<16UL>::alloc
                                          ((FixedSizeAllocator<16UL> *)
                                           (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
              this_00 = local_d8;
              *puVar10 = uVar3 & 0x3fffffff;
              *(uint **)(puVar10 + 2) = local_118;
              __l._M_len = 1;
              __l._M_array = &local_110;
              local_110._content = TVar23._content;
              std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
                        ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_b0,
                         __l,(allocator_type *)&local_11c);
              pFVar11 = InductionContext::getFormulaWithFreeVar
                                  (this_00,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>
                                            *)&local_b0,true,(uint)local_e0,(TermList *)&local_88,
                                   (Substitution *)0x0);
              pvVar7 = (void *)CONCAT44(local_b0._size,local_b0._timestamp);
              if (pvVar7 != (void *)0x0) {
                operator_delete(pvVar7,CONCAT44(local_b0._nextExpansionOccupancy,local_b0._capacity)
                                       - (long)pvVar7);
              }
              pFVar12 = (FormulaList *)
                        ::Lib::FixedSizeAllocator<16UL>::alloc
                                  ((FixedSizeAllocator<16UL> *)
                                   (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
              uVar3 = uVar4 + 2;
              pFVar12->_head = pFVar11;
              pFVar12->_tail = local_d0;
              local_118 = puVar10;
              local_d0 = pFVar12;
            }
            ith = ith + 1;
            puVar10 = puVar8;
            uVar4 = uVar3;
            local_128 = local_118;
          } while ((uint)local_38 != ith);
        }
        local_88._capacity = (size_t)(uVar3 * 4 + 1);
        puVar10 = (uint *)::Lib::FixedSizeAllocator<16UL>::alloc
                                    ((FixedSizeAllocator<16UL> *)
                                     (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
        *puVar10 = uVar3 & 0x3fffffff;
        *(uint **)(puVar10 + 2) = local_40;
        local_110._content =
             (uint64_t)
             Kernel::Term::create
                       (local_c8->_functor,
                        (uint)((ulong)((long)stack0xffffffffffffff08 -
                                      (long)CONCAT44(local_108._12_4_,local_108._8_4_)) >> 3),
                        (TermList *)CONCAT44(local_108._12_4_,local_108._8_4_));
        __l_00._M_len = 1;
        __l_00._M_array = &local_110;
        std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
                  ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_b0,__l_00,
                   (allocator_type *)&local_11c);
        pFVar11 = InductionContext::getFormulaWithFreeVar
                            (local_d8,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *
                                      )&local_b0,true,(uint)local_e0,(TermList *)&local_88,
                             (Substitution *)0x0);
        pvVar7 = (void *)CONCAT44(local_b0._size,local_b0._timestamp);
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,CONCAT44(local_b0._nextExpansionOccupancy,local_b0._capacity) -
                                 (long)pvVar7);
        }
        if (local_128 != (uint *)0x0) {
          pFVar13 = (Formula *)
                    ::Lib::FixedSizeAllocator<64UL>::alloc
                              ((FixedSizeAllocator<64UL> *)
                               (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
          pFVar14 = Kernel::JunctionFormula::generalJunction(AND,local_d0);
          pFVar13->_connective = IMP;
          (pFVar13->_label)._M_dataplus._M_p = (pointer)&(pFVar13->_label).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pFVar13->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                     DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
          *(Formula **)(pFVar13 + 1) = pFVar14;
          pFVar13[1]._label._M_dataplus._M_p = (pointer)pFVar11;
          pFVar11 = pFVar13;
        }
        puVar15 = (undefined8 *)
                  ::Lib::FixedSizeAllocator<16UL>::alloc
                            ((FixedSizeAllocator<16UL> *)
                             (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
        *puVar15 = pFVar11;
        puVar15[1] = local_48;
        puVar2 = (undefined8 *)CONCAT44(local_108._12_4_,local_108._8_4_);
        if (puVar2 != (undefined8 *)0x0) {
          uVar16 = CONCAT44(local_108._4_4_,local_108._0_4_) * 8 + 0xfU & 0xfffffffffffffff0;
          if (uVar16 == 0) {
            *puVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar2;
          }
          else if (uVar16 < 0x11) {
            *puVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar2;
          }
          else if (uVar16 < 0x19) {
            *puVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar2;
          }
          else if (uVar16 < 0x21) {
            *puVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar2;
          }
          else if (uVar16 < 0x31) {
            *puVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar2;
          }
          else if (uVar16 < 0x41) {
            *puVar2 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar2;
          }
          else {
            operator_delete(puVar2,0x10);
          }
        }
        uVar3 = uVar3 + 1;
        uVar16 = local_b8 + 1;
      } while (uVar16 < local_c0->_n);
    }
    local_118 = puVar10;
    puVar17 = (undefined4 *)
              ::Lib::FixedSizeAllocator<48UL>::alloc
                        ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    *puVar17 = 1;
    *(undefined4 **)(puVar17 + 2) = puVar17 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar17 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(undefined8 **)(puVar17 + 10) = puVar15;
    local_88._capacity = (size_t)(uVar3 * 4 + 1);
    local_110._content = (uint64_t)(uVar3 * 4 + 5);
    local_108._0_4_ = 1;
    local_108._4_4_ = 0;
    local_108._8_4_ = 0;
    local_108._12_4_ = 0;
    local_108._16_4_ = 0;
    iStack_f4 = 0;
    uStack_f0._0_4_ = 0;
    uStack_f0._4_4_ = 0;
    uStack_e8 = 0;
    local_e4 = 0;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_88;
    std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
              ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_b0,__l_01,
               (allocator_type *)&local_11c);
    pFVar11 = InductionContext::getFormulaWithFreeVar
                        (local_d8,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                                  &local_b0,true,(uint)local_e0,&local_110,(Substitution *)local_108
                        );
    pvVar7 = (void *)CONCAT44(local_b0._size,local_b0._timestamp);
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,CONCAT44(local_b0._nextExpansionOccupancy,local_b0._capacity) -
                             (long)pvVar7);
    }
    puVar18 = (undefined4 *)
              ::Lib::FixedSizeAllocator<64UL>::alloc
                        ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    *puVar18 = 3;
    *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar18 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(undefined4 **)(puVar18 + 10) = puVar17;
    *(Formula **)(puVar18 + 0xc) = pFVar11;
    puVar17 = (undefined4 *)
              ::Lib::FixedSizeAllocator<64UL>::alloc
                        ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    piVar19 = (int *)::Lib::FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)
                                (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    local_c8 = (TermAlgebraConstructor *)CONCAT44(local_c8._4_4_,uVar3 + 1);
    *piVar19 = uVar3 + 1;
    piVar19[2] = 0;
    piVar19[3] = 0;
    *puVar17 = 8;
    *(undefined4 **)(puVar17 + 2) = puVar17 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar17 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(int **)(puVar17 + 10) = piVar19;
    *(undefined8 *)(puVar17 + 0xc) = 0;
    *(undefined4 **)(puVar17 + 0xe) = puVar18;
    puVar18 = (undefined4 *)
              ::Lib::FixedSizeAllocator<64UL>::alloc
                        ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    puVar10 = (uint *)::Lib::FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)
                                 (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    *puVar10 = uVar3 & 0x3fffffff;
    puVar10[2] = 0;
    puVar10[3] = 0;
    *puVar18 = 7;
    *(undefined4 **)(puVar18 + 2) = puVar18 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar18 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(uint **)(puVar18 + 10) = puVar10;
    *(undefined8 *)(puVar18 + 0xc) = 0;
    *(undefined4 **)(puVar18 + 0xe) = puVar17;
    pFVar11 = (Formula *)
              ::Lib::FixedSizeAllocator<64UL>::alloc
                        ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    pFVar11->_connective = FORALL;
    (pFVar11->_label)._M_dataplus._M_p = (pointer)&(pFVar11->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar11->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(uint **)(pFVar11 + 1) = local_118;
    pFVar11[1]._label._M_dataplus._M_p = (pointer)0x0;
    pFVar11[1]._label._M_string_length = (size_type)puVar18;
    if (local_128 != (uint *)0x0) {
      pFVar13 = (Formula *)
                ::Lib::FixedSizeAllocator<64UL>::alloc
                          ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                          );
      pFVar13->_connective = EXISTS;
      (pFVar13->_label)._M_dataplus._M_p = (pointer)&(pFVar13->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar13->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(uint **)(pFVar13 + 1) = local_128;
      pFVar13[1]._label._M_dataplus._M_p = (pointer)0x0;
      pFVar13[1]._label._M_string_length = (size_type)pFVar11;
      pFVar11 = pFVar13;
    }
    if (puVar8 != (uint *)0x0) {
      pFVar13 = (Formula *)
                ::Lib::FixedSizeAllocator<64UL>::alloc
                          ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                          );
      pFVar13->_connective = EXISTS;
      (pFVar13->_label)._M_dataplus._M_p = (pointer)&(pFVar13->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar13->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(uint **)(pFVar13 + 1) = puVar8;
      pFVar13[1]._label._M_dataplus._M_p = (pointer)0x0;
      pFVar13[1]._label._M_string_length = (size_type)pFVar11;
      pFVar11 = pFVar13;
    }
    local_b0._timestamp = 1;
    local_b0._size = 0;
    local_b0._deleted = 0;
    local_b0._capacityIndex = 0;
    local_b0._capacity = 0;
    local_b0._nextExpansionOccupancy = 0;
    local_b0._entries._0_4_ = 0;
    local_b0._28_8_ = 0;
    local_b0._afterLast._4_4_ = 0;
    __len = 0x94;
    produceClauses(&local_88,local_58,pFVar11,STRUCT_INDUCTION_AXIOM_ONE,local_d8,&local_b0);
    local_11c = (uint)local_c8;
    pEVar20 = ::Lib::DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
              findEntry(&local_b0,&local_11c);
    this_02 = local_60;
    if (pEVar20 == (Entry *)0x0) {
      pTVar21 = (Term *)0x0;
    }
    else {
      pTVar21 = pEVar20->_val;
    }
    pTVar21 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                        (pTVar21,(Substitution *)local_108,false);
    Kernel::Substitution::bind(this_02,(int)local_e0,(sockaddr *)pTVar21,__len);
    Indexing::InductionFormulaIndex::Entry::add(local_68,&local_88,(Substitution *)local_108);
    if (local_88._stack != (Clause **)0x0) {
      uVar16 = local_88._capacity * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar16 == 0) {
        *local_88._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_88._stack;
      }
      else if (uVar16 < 0x11) {
        *local_88._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_88._stack;
      }
      else if (uVar16 < 0x19) {
        *local_88._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_88._stack;
      }
      else if (uVar16 < 0x21) {
        *local_88._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_88._stack;
      }
      else if (uVar16 < 0x31) {
        *local_88._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_88._stack;
      }
      else if (uVar16 < 0x41) {
        *local_88._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_88._stack;
      }
      else {
        operator_delete(local_88._stack,0x10);
      }
    }
    ::Lib::DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&local_b0);
    ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               local_108);
  }
  return;
}

Assistant:

void InductionClauseIterator::performStructInductionFreeVar(const InductionContext& context, InductionFormulaIndex::Entry* e, Substitution* freeVarSubst)
{
  if (context._indTerms.size() > 1) return;
  TermAlgebra* ta = env.signature->getTermAlgebraOfSort(SortHelper::getResultSort(context._indTerms[0]));
  unsigned freeVar = context.getFreeVariable(); // variable free in the induction literal
  unsigned var = freeVar+1; // used in the following to construct new variables
  for (const auto& kv : context._cls) {
    if (kv.first->maxVar() + 1 > var) {
      var = kv.first->maxVar() + 1;
    }
  }
  VList* us = VList::empty();
  VList* ws = VList::empty();
  VList* ys = VList::empty();
  FormulaList* formulas = FormulaList::empty();

  // Construct premise as a conjunction of steps.
  // Each step's antecedent contains a fresh free variable in place
  // of freeVar (collected in `ws`), each step's conclusion too (collected in `us`).
  for (unsigned i = 0; i < ta->nConstructors(); i++){
    TermAlgebraConstructor* con = ta->constructor(i);
    unsigned arity = con->arity();
    TermStack argTerms(arity); // Arguments of the step case antecedent: y_1, ..., y_arity
    FormulaList* hyps = FormulaList::empty();
    for (unsigned j = 0; j < arity; j++){
      TermList y(var++, false);
      argTerms.push(y);
      VList::push(y.var(), ys);
      if (con->argSort(j) == con->rangeSort()){
        TermList w(var++, false);
        VList::push(w.var(), ws);
        Formula* curLit = context.getFormulaWithFreeVar({ y }, true, freeVar, w);
        FormulaList::push(curLit, hyps); // L[y_j, w_j]
      }
    }
    TermList u(var++, false);
    VList::push(u.var(), us);
    Term* tcons = Term::create(con->functor(), (unsigned)argTerms.size(), argTerms.begin());
    Formula* consequent = context.getFormulaWithFreeVar({ TermList(tcons) }, true, freeVar, u);
    Formula* step = (VList::isEmpty(ws)) ? consequent :
      new BinaryFormula(Connective::IMP, JunctionFormula::generalJunction(Connective::AND, hyps), consequent); // (/\_{j ∈ P_c} L[y_j, w_j]) --> L[cons(y_1, ..., y_n), u_i]
    formulas->push(step, formulas);
  }
  Formula* formula = new JunctionFormula(Connective::AND, formulas);

  // Construct conclusion: L[z, x]
  TermList z(var++, false);
  const unsigned xvar = var;
  TermList x(var++, false);
  Substitution subst;
  Formula* conclusion = context.getFormulaWithFreeVar({ z }, true, freeVar, x, &subst);
  // Put together the whole induction axiom:
  formula = new BinaryFormula(Connective::IMP, formula, conclusion);
  formula = new QuantifiedFormula(Connective::EXISTS, VList::singleton(xvar), SList::empty(), formula);
  formula = new QuantifiedFormula(Connective::FORALL, VList::singleton(z.var()), SList::empty(), formula);
  formula = new QuantifiedFormula(Connective::FORALL, us, SList::empty(), formula);
  if (!VList::isEmpty(ws)) {
    formula = new QuantifiedFormula(Connective::EXISTS, ws, SList::empty(), formula);
  }
  if (!VList::isEmpty(ys)) {
    formula = new QuantifiedFormula(Connective::EXISTS, ys, SList::empty(), formula);
  }

  // Produce induction clauses and obtain the skolemization bindings.
  DHMap<unsigned, Term*> bindings;
  ClauseStack hyp_clauses = produceClauses(formula, InferenceRule::STRUCT_INDUCTION_AXIOM_ONE, context, &bindings); 
  // Bind freeVar to its corresponding skolem term in freeVarSubst.
  // This is used later in resolution.
  Term* xSkolem = bindings.get(xvar, nullptr);
  ASS(xSkolem != nullptr);
  ASS(freeVarSubst != nullptr);
  freeVarSubst->bind(int(freeVar), SubstHelper::apply<Substitution>(xSkolem, subst));

  e->add(std::move(hyp_clauses), std::move(subst));
  return;
}